

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O2

Matrix<double,__1,_1,_0,__1,_1> __thiscall
dynamicgraph::signal_io_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cast
          (signal_io_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this,istringstream *is)

{
  ExceptionSignal *this_00;
  Index extraout_RDX;
  Matrix<double,__1,_1,_0,__1,_1> MVar1;
  ErrorCodeEnum local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  Eigen::operator>>(is,(Vector *)this);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    MVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    MVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (Matrix<double,__1,_1,_0,__1,_1>)
           MVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_64 = GENERIC;
  std::__cxx11::stringbuf::str();
  std::operator+(&local_40,"failed to serialize ",&local_60);
  dynamicgraph::ExceptionSignal::ExceptionSignal(this_00,&local_64,(string *)&local_40);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

inline static T cast(std::istringstream &is) {
    T inst;
    is >> inst;
    if (is.fail()) {
      throw ExceptionSignal(ExceptionSignal::GENERIC,
                            "failed to serialize " + is.str());
    }
    return inst;
  }